

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

uint32_t helper_rsqrte_f16_aarch64(uint32_t input,void *fpstp)

{
  float16 fVar1;
  ushort uVar2;
  int iVar3;
  uint64_t uVar4;
  float16 nan;
  int f16_exp;
  uint local_1c;
  
  fVar1 = float16_squash_input_denormal_aarch64((float16)input,(float_status *)fpstp);
  local_1c = fVar1 >> 10 & 0x1f;
  uVar2 = fVar1 & 0x7fff;
  if (uVar2 < 0x7c01) {
    if (uVar2 != 0) {
      if ((short)fVar1 < 0) {
        float_raise_aarch64('\x01',(float_status *)fpstp);
        fVar1 = float16_default_nan_aarch64((float_status *)fpstp);
        return (uint)fVar1;
      }
      if (uVar2 == 0x7c00) {
        return 0;
      }
      uVar4 = recip_sqrt_estimate((int *)&local_1c,0x2c,(ulong)(fVar1 & 0x3ff) << 0x2a);
      return (uint)(uVar4 >> 0x2a) & 0x3fc | (local_1c & 0x1f) << 10;
    }
    float_raise_aarch64('\x04',(float_status *)fpstp);
    fVar1 = fVar1 | 0x7c00;
  }
  else {
    iVar3 = float16_is_signaling_nan_aarch64(fVar1,(float_status *)fpstp);
    if (iVar3 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      fVar1 = float16_silence_nan_aarch64(fVar1,(float_status *)fpstp);
    }
    if (*(char *)((long)fpstp + 6) != '\0') {
      fVar1 = float16_default_nan_aarch64((float_status *)fpstp);
    }
  }
  return (uint)fVar1;
}

Assistant:

uint32_t HELPER(rsqrte_f16)(uint32_t input, void *fpstp)
{
    float_status *s = fpstp;
    float16 f16 = float16_squash_input_denormal(input, s);
    uint16_t val = float16_val(f16);
    bool f16_sign = float16_is_neg(f16);
    int f16_exp = extract32(val, 10, 5);
    uint16_t f16_frac = extract32(val, 0, 10);
    uint64_t f64_frac;

    if (float16_is_any_nan(f16)) {
        float16 nan = f16;
        if (float16_is_signaling_nan(f16, s)) {
            float_raise(float_flag_invalid, s);
            nan = float16_silence_nan(f16, s);
        }
        if (s->default_nan_mode) {
            nan =  float16_default_nan(s);
        }
        return nan;
    } else if (float16_is_zero(f16)) {
        float_raise(float_flag_divbyzero, s);
        return float16_set_sign(float16_infinity, f16_sign);
    } else if (f16_sign) {
        float_raise(float_flag_invalid, s);
        return float16_default_nan(s);
    } else if (float16_is_infinity(f16)) {
        return float16_zero;
    }

    /* Scale and normalize to a double-precision value between 0.25 and 1.0,
     * preserving the parity of the exponent.  */

    f64_frac = ((uint64_t) f16_frac) << (52 - 10);

    f64_frac = recip_sqrt_estimate(&f16_exp, 44, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(2) */
    val = deposit32(0, 15, 1, f16_sign);
    val = deposit32(val, 10, 5, f16_exp);
    val = deposit32(val, 2, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float16(val);
}